

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void jmp_list_patch(Parser *psr,int head_idx,int target_idx)

{
  int iVar1;
  
  do {
    if (head_idx < 0) {
      return;
    }
    iVar1 = jmp_follow(psr,head_idx);
    jmp_set_target(psr,head_idx,target_idx);
    head_idx = iVar1;
  } while (iVar1 != -1);
  return;
}

Assistant:

static void jmp_list_patch(Parser *psr, int head_idx, int target_idx) {
	if (head_idx < 0) {
		// Don't do anything if the list is empty
	} else if (jmp_follow(psr, head_idx) == -1) {
		// We've reached the last element in the jump list
		jmp_set_target(psr, head_idx, target_idx);
	} else {
		// Preserve the next JMP in the list
		int next_idx = jmp_follow(psr, head_idx);
		jmp_set_target(psr, head_idx, target_idx);

		// Do the recursive call last so hopefully the compiler can do a tail
		// call optimisation
		jmp_list_patch(psr, next_idx, target_idx);
	}
}